

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::anon_unknown_0::FirstGroup::init(FirstGroup *this,EVP_PKEY_CTX *ctx)

{
  ulong *puVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 *puVar3;
  DrawTest *this_00;
  long *extraout_RAX;
  TestIterationType type;
  ulong uVar5;
  long lVar6;
  string desc;
  string name;
  DrawTestSpec spec;
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  ulong *local_258;
  long local_250;
  ulong local_248;
  undefined8 uStack_240;
  long *local_238;
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  DrawTestSpec local_1f8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  long *plVar4;
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  genBasicSpec(&local_1f8,this->m_method);
  lVar6 = 0;
  do {
    local_258 = &local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"first_","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar2 = *(int *)((long)&DAT_01bda130 + lVar6);
    std::ostream::operator<<(local_1a8,iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar5 = 0xf;
    if (local_258 != &local_248) {
      uVar5 = local_248;
    }
    if (uVar5 < (ulong)(local_270 + local_250)) {
      uVar5 = 0xf;
      if (local_278 != local_268) {
        uVar5 = local_268[0];
      }
      if (uVar5 < (ulong)(local_270 + local_250)) goto LAB_00fc7971;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_258);
    }
    else {
LAB_00fc7971:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_278);
    }
    local_238 = &local_228;
    plVar4 = puVar3 + 2;
    if ((long *)*puVar3 == plVar4) {
      local_228 = *plVar4;
      uStack_220 = puVar3[3];
    }
    else {
      local_228 = *plVar4;
      local_238 = (long *)*puVar3;
    }
    local_230 = puVar3[1];
    *puVar3 = plVar4;
    puVar3[1] = 0;
    *(undefined1 *)plVar4 = 0;
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"first ","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar5 = 0xf;
    if (local_278 != local_268) {
      uVar5 = local_268[0];
    }
    if (uVar5 < (ulong)(local_210 + local_270)) {
      uVar5 = 0xf;
      if (local_218 != local_208) {
        uVar5 = local_208[0];
      }
      if (uVar5 < (ulong)(local_210 + local_270)) goto LAB_00fc7aac;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_278);
    }
    else {
LAB_00fc7aac:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_218);
    }
    puVar1 = puVar3 + 2;
    if ((ulong *)*puVar3 == puVar1) {
      local_248 = *puVar1;
      uStack_240 = puVar3[3];
      local_258 = &local_248;
    }
    else {
      local_248 = *puVar1;
      local_258 = (ulong *)*puVar3;
    }
    local_250 = puVar3[1];
    *puVar3 = puVar1;
    puVar3[1] = 0;
    *(undefined1 *)puVar1 = 0;
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    this_00 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,(char *)local_238,
               (char *)local_258);
    local_1f8.first = iVar2;
    addTestIterations(this_00,&local_1f8,type);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    plVar4 = &local_228;
    if (local_238 != plVar4) {
      operator_delete(local_238,local_228 + 1);
      plVar4 = extraout_RAX;
    }
    iVar2 = (int)plVar4;
    lVar6 = lVar6 + 4;
    if (lVar6 == 0xc) {
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar2 = extraout_EAX;
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

void FirstGroup::init (void)
{
	const int firsts[] =
	{
		0, 1, 17
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); ++firstNdx)
	{
		const std::string	name = std::string("first_") + de::toString(firsts[firstNdx]);
		const std::string	desc = std::string("first ") + de::toString(firsts[firstNdx]);
		gls::DrawTest*		test = new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.first = firsts[firstNdx];

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}
}